

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbopacking64.h
# Opt level: O0

void packforblock2_64(uint64_t base,uint64_t **pin,uint8_t **pw)

{
  uint64_t *puVar1;
  uint64_t w0;
  uint64_t *in;
  uint64_t *pw64;
  uint8_t **pw_local;
  uint64_t **pin_local;
  uint64_t base_local;
  
  puVar1 = *pin;
  *(uint64_t *)*pw =
       puVar1[0x1f] - base << 0x3e |
       puVar1[0x1e] - base << 0x3c |
       puVar1[0x1d] - base << 0x3a |
       puVar1[0x1c] - base << 0x38 |
       puVar1[0x1b] - base << 0x36 |
       puVar1[0x1a] - base << 0x34 |
       puVar1[0x19] - base << 0x32 |
       puVar1[0x18] - base << 0x30 |
       puVar1[0x17] - base << 0x2e |
       puVar1[0x16] - base << 0x2c |
       puVar1[0x15] - base << 0x2a |
       puVar1[0x14] - base << 0x28 |
       puVar1[0x13] - base << 0x26 |
       puVar1[0x12] - base << 0x24 |
       puVar1[0x11] - base << 0x22 |
       puVar1[0x10] - base << 0x20 |
       (puVar1[0xf] - base) * 0x40000000 |
       (puVar1[0xe] - base) * 0x10000000 |
       (puVar1[0xd] - base) * 0x4000000 |
       (puVar1[0xc] - base) * 0x1000000 |
       (puVar1[0xb] - base) * 0x400000 |
       (puVar1[10] - base) * 0x100000 |
       (puVar1[9] - base) * 0x40000 |
       (puVar1[8] - base) * 0x10000 |
       (puVar1[7] - base) * 0x4000 |
       (puVar1[6] - base) * 0x1000 |
       (puVar1[5] - base) * 0x400 |
       (puVar1[4] - base) * 0x100 |
       (puVar1[3] - base) * 0x40 |
       (puVar1[2] - base) * 0x10 | (puVar1[1] - base) * 4 | *puVar1 - base;
  *pin = *pin + 0x20;
  *pw = *pw + 8;
  return;
}

Assistant:

static void packforblock2_64(const uint64_t base, const uint64_t ** pin, uint8_t ** pw) {
  uint64_t * pw64 = *(uint64_t **) pw;
  const uint64_t * in = *pin;
  /* we are going to touch  1 64-bit word */ 
  uint64_t w0;
  w0 = (in[0] - base);
  w0 |=  (in[1] - base) << 2;
  w0 |=  (in[2] - base) << 4;
  w0 |=  (in[3] - base) << 6;
  w0 |=  (in[4] - base) << 8;
  w0 |=  (in[5] - base) << 10;
  w0 |=  (in[6] - base) << 12;
  w0 |=  (in[7] - base) << 14;
  w0 |=  (in[8] - base) << 16;
  w0 |=  (in[9] - base) << 18;
  w0 |=  (in[10] - base) << 20;
  w0 |=  (in[11] - base) << 22;
  w0 |=  (in[12] - base) << 24;
  w0 |=  (in[13] - base) << 26;
  w0 |=  (in[14] - base) << 28;
  w0 |=  (in[15] - base) << 30;
  w0 |=  (in[16] - base) << 32;
  w0 |=  (in[17] - base) << 34;
  w0 |=  (in[18] - base) << 36;
  w0 |=  (in[19] - base) << 38;
  w0 |=  (in[20] - base) << 40;
  w0 |=  (in[21] - base) << 42;
  w0 |=  (in[22] - base) << 44;
  w0 |=  (in[23] - base) << 46;
  w0 |=  (in[24] - base) << 48;
  w0 |=  (in[25] - base) << 50;
  w0 |=  (in[26] - base) << 52;
  w0 |=  (in[27] - base) << 54;
  w0 |=  (in[28] - base) << 56;
  w0 |=  (in[29] - base) << 58;
  w0 |=  (in[30] - base) << 60;
  w0 |=  (in[31] - base) << 62;
  pw64[0] = w0;
  *pin += 32; /* we consumed 32 64-bit integers */ 
  *pw += 8; /* we used up 8 output bytes */ 
}